

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O0

adt_u32List_t * adt_u32List_new(void)

{
  adt_u32List_t *self_00;
  int *piVar1;
  adt_u32List_t *self;
  
  self_00 = (adt_u32List_t *)malloc(0x10);
  if (self_00 == (adt_u32List_t *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xc;
  }
  else {
    adt_u32List_create(self_00);
  }
  return self_00;
}

Assistant:

adt_u32List_t* adt_u32List_new(void)
{
   adt_u32List_t *self = (adt_u32List_t*) malloc(sizeof(adt_u32List_t));
   if (self != 0)
   {
      adt_u32List_create(self);
   }
   else
   {
      errno = ENOMEM;
   }
   return self;
}